

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

Vec_Int_t * Sim_UtilCountOnesArray(Vec_Ptr_t *vInfo,int nSimWords)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = vInfo->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar5 = uVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = uVar1;
  uVar10 = 0;
  memset(__s,0,(long)(int)uVar1 << 2);
  iVar2 = vInfo->nSize;
  if (0 < (long)iVar2) {
    ppvVar3 = vInfo->pArray;
    uVar6 = 1;
    if (1 < nSimWords * 4) {
      uVar6 = (ulong)(uint)(nSimWords * 4);
    }
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar10;
    }
    do {
      if (nSimWords < 1) {
        iVar8 = 0;
      }
      else {
        uVar9 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + bit_count[*(byte *)((long)ppvVar3[uVar10] + uVar9)];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      if (uVar10 == uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[uVar10] = iVar8;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (long)iVar2);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Sim_UtilCountOnesArray( Vec_Ptr_t * vInfo, int nSimWords )
{
    Vec_Int_t * vCounters;
    unsigned * pSimInfo;
    int i;
    vCounters = Vec_IntStart( Vec_PtrSize(vInfo) );
    Vec_PtrForEachEntry( unsigned *, vInfo, pSimInfo, i )
        Vec_IntWriteEntry( vCounters, i, Sim_UtilCountOnes(pSimInfo, nSimWords) );
    return vCounters;
}